

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  GLuint *pGVar1;
  SDLTest_CommonState *pSVar2;
  int iVar3;
  int iVar4;
  GLuint GVar5;
  GLenum GVar6;
  GLint GVar7;
  uint uVar8;
  uint uVar9;
  GLenum extraout_EAX;
  undefined8 uVar10;
  SDL_GLContext pvVar11;
  GLubyte *pGVar12;
  long lVar13;
  shader_data *psVar14;
  long lVar15;
  char *pcVar16;
  int iVar17;
  char cVar18;
  int value;
  int h;
  int w;
  SDL_DisplayMode mode;
  undefined4 local_58;
  int local_54;
  GLsizei local_50;
  GLsizei local_4c;
  undefined1 local_48;
  undefined1 local_47;
  
  cVar18 = (char)argc;
  state = (SDLTest_CommonState *)SDLTest_CommonCreateState(argv,0x20);
  if (state == (SDLTest_CommonState *)0x0) {
    return 1;
  }
  if (argc < 2) {
    local_54 = 0;
    cVar18 = true;
  }
  else {
    iVar17 = 1;
    local_54 = 0;
    iVar4 = 0;
    do {
      iVar3 = SDLTest_CommonArg(state,iVar17);
      if (iVar3 == 0) {
        iVar3 = SDL_strcasecmp(argv[iVar17],"--fsaa");
        if (iVar3 == 0) {
          local_54 = local_54 + 1;
        }
        else {
          iVar3 = SDL_strcasecmp(argv[iVar17],"--accel");
          if (iVar3 == 0) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar3 = SDL_strcasecmp(argv[iVar17],"--zdepth");
            if ((iVar3 != 0) || (argv[(long)iVar17 + 1] == (char *)0x0)) goto LAB_00105121;
            iVar17 = iVar17 + 1;
            depth = SDL_atoi();
          }
        }
        iVar3 = 1;
      }
      else if (iVar3 < 0) {
LAB_00105121:
        pcVar16 = *argv;
        uVar10 = SDLTest_CommonUsage(state);
        SDL_Log("Usage: %s %s [--fsaa] [--accel] [--zdepth %%d]\n",pcVar16,uVar10);
        goto LAB_00105144;
      }
      iVar17 = iVar17 + iVar3;
    } while (iVar17 < argc);
    cVar18 = iVar4 == 0;
  }
  pSVar2 = state;
  *(byte *)&state->window_flags = (byte)state->window_flags | 0x33;
  pSVar2->gl_red_size = 5;
  pSVar2->gl_green_size = 5;
  pSVar2->gl_blue_size = 5;
  pSVar2->gl_depth_size = depth;
  pSVar2->gl_major_version = 2;
  pSVar2->gl_minor_version = 0;
  pSVar2->gl_profile_mask = 4;
  if (local_54 != 0) {
    pSVar2->gl_multisamplebuffers = 1;
    pSVar2->gl_multisamplesamples = local_54;
  }
  if ((bool)cVar18 == false) {
    pSVar2->gl_accelerated = 1;
  }
  iVar4 = SDLTest_CommonInit(pSVar2);
  if (iVar4 == 0) goto LAB_00105832;
  context = (SDL_GLContext *)SDL_calloc((long)state->num_windows,8);
  if (context != (SDL_GLContext *)0x0) goto LAB_0010514e;
  pcVar16 = "Out of memory!\n";
  do {
    SDL_Log(pcVar16);
LAB_00105832:
    quit(2);
    do {
      do {
        SDL_GL_SetSwapInterval(state->render_flags >> 2 & 1);
        SDL_GetCurrentDisplayMode(0,&local_48);
        SDL_Log("Screen bpp: %d\n",local_47);
        SDL_Log("\n");
        pGVar12 = (*ctx.glGetString)(0x1f00);
        SDL_Log("Vendor     : %s\n",pGVar12);
        pGVar12 = (*ctx.glGetString)(0x1f01);
        SDL_Log("Renderer   : %s\n",pGVar12);
        pGVar12 = (*ctx.glGetString)(0x1f02);
        SDL_Log("Version    : %s\n",pGVar12);
        pGVar12 = (*ctx.glGetString)(0x1f03);
        SDL_Log("Extensions : %s\n",pGVar12);
        SDL_Log("\n");
        iVar4 = SDL_GL_GetAttribute(0,&local_58);
        if (iVar4 == 0) {
          SDL_Log("SDL_GL_RED_SIZE: requested %d, got %d\n",5,local_58);
        }
        else {
          uVar10 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_RED_SIZE: %s\n",uVar10);
        }
        iVar4 = SDL_GL_GetAttribute(1,&local_58);
        if (iVar4 == 0) {
          SDL_Log("SDL_GL_GREEN_SIZE: requested %d, got %d\n",5,local_58);
        }
        else {
          uVar10 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_GREEN_SIZE: %s\n",uVar10);
        }
        iVar4 = SDL_GL_GetAttribute(2,&local_58);
        if (iVar4 == 0) {
          SDL_Log("SDL_GL_BLUE_SIZE: requested %d, got %d\n",5,local_58);
        }
        else {
          uVar10 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_BLUE_SIZE: %s\n",uVar10);
        }
        iVar4 = SDL_GL_GetAttribute(6,&local_58);
        if (iVar4 == 0) {
          SDL_Log("SDL_GL_DEPTH_SIZE: requested %d, got %d\n",depth,local_58);
        }
        else {
          uVar10 = SDL_GetError();
          SDL_Log("Failed to get SDL_GL_DEPTH_SIZE: %s\n",uVar10);
        }
        if (local_54 != 0) {
          iVar4 = SDL_GL_GetAttribute(0xd,&local_58);
          if (iVar4 == 0) {
            SDL_Log("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n",local_58);
          }
          else {
            uVar10 = SDL_GetError();
            SDL_Log("Failed to get SDL_GL_MULTISAMPLEBUFFERS: %s\n",uVar10);
          }
          iVar4 = SDL_GL_GetAttribute(0xe,&local_58);
          if (iVar4 == 0) {
            SDL_Log("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n",local_54,local_58);
          }
          else {
            uVar10 = SDL_GetError();
            SDL_Log("Failed to get SDL_GL_MULTISAMPLESAMPLES: %s\n",uVar10);
          }
        }
        if (cVar18 == '\0') {
          iVar4 = SDL_GL_GetAttribute(0xf,&local_58);
          if (iVar4 == 0) {
            SDL_Log("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n",local_58);
          }
          else {
            uVar10 = SDL_GetError();
            SDL_Log("Failed to get SDL_GL_ACCELERATED_VISUAL: %s\n",uVar10);
          }
        }
        datas = (shader_data *)SDL_calloc((long)state->num_windows,0x24);
        if (0 < state->num_windows) {
          lVar13 = 0;
          lVar15 = 0;
          do {
            iVar4 = SDL_GL_MakeCurrent(state->windows[lVar15],context[lVar15]);
            if (iVar4 == 0) {
              SDL_GL_GetDrawableSize(state->windows[lVar15],&local_4c,&local_50);
              (*ctx.glViewport)(0,0,local_4c,local_50);
              psVar14 = datas;
              pGVar1 = &datas->shader_vert;
              *(undefined8 *)((long)&datas->angle_x + lVar13) = 0;
              *(undefined4 *)((long)&psVar14->angle_z + lVar13) = 0;
              process_shader((GLuint *)((long)pGVar1 + lVar13),_shader_vert_src,0x8b31);
              pGVar1 = (GLuint *)((long)&psVar14->shader_program + lVar13);
              process_shader(pGVar1 + 1,_shader_frag_src,0x8b30);
              GVar5 = (*ctx.glCreateProgram)();
              *pGVar1 = GVar5;
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) goto LAB_00105ded;
              (*ctx.glAttachShader)
                        (*(GLuint *)((long)&psVar14->shader_program + lVar13),
                         *(GLuint *)((long)&psVar14->shader_vert + lVar13));
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x295;
                goto LAB_00105ef9;
              }
              (*ctx.glAttachShader)
                        (*(GLuint *)((long)&psVar14->shader_program + lVar13),
                         *(GLuint *)((long)&psVar14->shader_frag + lVar13));
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x296;
                goto LAB_00105ef9;
              }
              (*ctx.glLinkProgram)(*(GLuint *)((long)&psVar14->shader_program + lVar13));
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x297;
                goto LAB_00105ef9;
              }
              GVar7 = (*ctx.glGetAttribLocation)
                                (*(GLuint *)((long)&psVar14->shader_program + lVar13),"av4position")
              ;
              *(GLint *)((long)&psVar14->attr_position + lVar13) = GVar7;
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x29a;
                goto LAB_00105ef9;
              }
              GVar7 = (*ctx.glGetAttribLocation)
                                (*(GLuint *)((long)&psVar14->shader_program + lVar13),"av3color");
              *(GLint *)((long)&psVar14->attr_color + lVar13) = GVar7;
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x29b;
                goto LAB_00105ef9;
              }
              GVar7 = (*ctx.glGetUniformLocation)
                                (*(GLuint *)((long)&psVar14->shader_program + lVar13),"mvp");
              *(GLint *)((long)&psVar14->attr_mvp + lVar13) = GVar7;
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x29e;
                goto LAB_00105ef9;
              }
              (*ctx.glUseProgram)(*(GLuint *)((long)&psVar14->shader_program + lVar13));
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x2a0;
                goto LAB_00105ef9;
              }
              (*ctx.glEnableVertexAttribArray)(*(GLuint *)((long)&psVar14->attr_position + lVar13));
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x2a3;
                goto LAB_00105ef9;
              }
              (*ctx.glEnableVertexAttribArray)(*(GLuint *)((long)&psVar14->attr_color + lVar13));
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x2a4;
                goto LAB_00105ef9;
              }
              (*ctx.glVertexAttribPointer)
                        (*(GLuint *)((long)&psVar14->attr_position + lVar13),3,0x1406,'\0',0,
                         _vertices);
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x2a7;
                goto LAB_00105ef9;
              }
              (*ctx.glVertexAttribPointer)
                        (*(GLuint *)((long)&psVar14->attr_color + lVar13),3,0x1406,'\0',0,_colors);
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x2a8;
                goto LAB_00105ef9;
              }
              (*ctx.glEnable)(0xb44);
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x2aa;
                goto LAB_00105ef9;
              }
              (*ctx.glEnable)(0xb71);
              GVar6 = (*ctx.glGetError)();
              if (GVar6 != 0) {
                uVar10 = 0x2ab;
                goto LAB_00105ef9;
              }
            }
            else {
              uVar10 = SDL_GetError();
              SDL_Log("SDL_GL_MakeCurrent(): %s\n",uVar10);
            }
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 0x24;
          } while (lVar15 < state->num_windows);
        }
        psVar14 = (shader_data *)0x0;
        frames = 0;
        uVar8 = SDL_GetTicks();
        done = 0;
        do {
          loop();
        } while (done == 0);
        uVar9 = SDL_GetTicks();
        if (uVar8 <= uVar9 && uVar9 - uVar8 != 0) {
          SDL_Log(((double)frames * 1000.0) / (double)(uVar9 - uVar8));
        }
        quit(0);
        GVar6 = extraout_EAX;
LAB_00105ded:
        uVar10 = 0x292;
LAB_00105ef9:
        cVar18 = (char)psVar14;
        SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar6,GVar6,uVar10);
LAB_00105144:
        quit(1);
LAB_0010514e:
        if (0 < state->num_windows) {
          lVar13 = 0;
          do {
            pvVar11 = (SDL_GLContext)SDL_GL_CreateContext(state->windows[lVar13]);
            context[lVar13] = pvVar11;
            if (pvVar11 == (SDL_GLContext)0x0) {
              uVar10 = SDL_GetError();
              SDL_Log("SDL_GL_CreateContext(): %s\n",uVar10);
              goto LAB_00105832;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < state->num_windows);
        }
        pcVar16 = "glActiveTexture";
        ctx.glActiveTexture = (_func_void_GLenum *)SDL_GL_GetProcAddress("glActiveTexture");
        if (ctx.glActiveTexture == (_func_void_GLenum *)0x0) break;
        pcVar16 = "glAttachShader";
        ctx.glAttachShader = (_func_void_GLuint_GLuint *)SDL_GL_GetProcAddress("glAttachShader");
        if (ctx.glAttachShader == (_func_void_GLuint_GLuint *)0x0) break;
        pcVar16 = "glBindAttribLocation";
        ctx.glBindAttribLocation =
             (_func_void_GLuint_GLuint_char_ptr *)SDL_GL_GetProcAddress("glBindAttribLocation");
        if (ctx.glBindAttribLocation == (_func_void_GLuint_GLuint_char_ptr *)0x0) break;
        pcVar16 = "glBindTexture";
        ctx.glBindTexture = (_func_void_GLenum_GLuint *)SDL_GL_GetProcAddress("glBindTexture");
        if (ctx.glBindTexture == (_func_void_GLenum_GLuint *)0x0) break;
        pcVar16 = "glBlendFuncSeparate";
        ctx.glBlendFuncSeparate =
             (_func_void_GLenum_GLenum_GLenum_GLenum *)SDL_GL_GetProcAddress("glBlendFuncSeparate");
        if (ctx.glBlendFuncSeparate == (_func_void_GLenum_GLenum_GLenum_GLenum *)0x0) break;
        pcVar16 = "glClear";
        ctx.glClear = (_func_void_GLbitfield *)SDL_GL_GetProcAddress("glClear");
        if (ctx.glClear == (_func_void_GLbitfield *)0x0) break;
        pcVar16 = "glClearColor";
        ctx.glClearColor =
             (_func_void_GLclampf_GLclampf_GLclampf_GLclampf *)SDL_GL_GetProcAddress("glClearColor")
        ;
        if (ctx.glClearColor == (_func_void_GLclampf_GLclampf_GLclampf_GLclampf *)0x0) break;
        pcVar16 = "glCompileShader";
        ctx.glCompileShader = (_func_void_GLuint *)SDL_GL_GetProcAddress("glCompileShader");
        if (ctx.glCompileShader == (_func_void_GLuint *)0x0) break;
        pcVar16 = "glCreateProgram";
        ctx.glCreateProgram = (_func_GLuint *)SDL_GL_GetProcAddress("glCreateProgram");
        if (ctx.glCreateProgram == (_func_GLuint *)0x0) break;
        pcVar16 = "glCreateShader";
        ctx.glCreateShader = (_func_GLuint_GLenum *)SDL_GL_GetProcAddress("glCreateShader");
        if (ctx.glCreateShader == (_func_GLuint_GLenum *)0x0) break;
        pcVar16 = "glDeleteProgram";
        ctx.glDeleteProgram = (_func_void_GLuint *)SDL_GL_GetProcAddress("glDeleteProgram");
        if (ctx.glDeleteProgram == (_func_void_GLuint *)0x0) break;
        pcVar16 = "glDeleteShader";
        ctx.glDeleteShader = (_func_void_GLuint *)SDL_GL_GetProcAddress("glDeleteShader");
        if (ctx.glDeleteShader == (_func_void_GLuint *)0x0) break;
        pcVar16 = "glDeleteTextures";
        ctx.glDeleteTextures =
             (_func_void_GLsizei_GLuint_ptr *)SDL_GL_GetProcAddress("glDeleteTextures");
        if (ctx.glDeleteTextures == (_func_void_GLsizei_GLuint_ptr *)0x0) break;
        pcVar16 = "glDisable";
        ctx.glDisable = (_func_void_GLenum *)SDL_GL_GetProcAddress("glDisable");
        if (ctx.glDisable == (_func_void_GLenum *)0x0) break;
        pcVar16 = "glDisableVertexAttribArray";
        ctx.glDisableVertexAttribArray =
             (_func_void_GLuint *)SDL_GL_GetProcAddress("glDisableVertexAttribArray");
        if (ctx.glDisableVertexAttribArray == (_func_void_GLuint *)0x0) break;
        pcVar16 = "glDrawArrays";
        ctx.glDrawArrays = (_func_void_GLenum_GLint_GLsizei *)SDL_GL_GetProcAddress("glDrawArrays");
        if (ctx.glDrawArrays == (_func_void_GLenum_GLint_GLsizei *)0x0) break;
        pcVar16 = "glEnable";
        ctx.glEnable = (_func_void_GLenum *)SDL_GL_GetProcAddress("glEnable");
        if (ctx.glEnable == (_func_void_GLenum *)0x0) break;
        pcVar16 = "glEnableVertexAttribArray";
        ctx.glEnableVertexAttribArray =
             (_func_void_GLuint *)SDL_GL_GetProcAddress("glEnableVertexAttribArray");
        if (ctx.glEnableVertexAttribArray == (_func_void_GLuint *)0x0) break;
        pcVar16 = "glFinish";
        ctx.glFinish = (_func_void *)SDL_GL_GetProcAddress("glFinish");
        if (ctx.glFinish == (_func_void *)0x0) break;
        pcVar16 = "glGenFramebuffers";
        ctx.glGenFramebuffers =
             (_func_void_GLsizei_GLuint_ptr *)SDL_GL_GetProcAddress("glGenFramebuffers");
        if (ctx.glGenFramebuffers == (_func_void_GLsizei_GLuint_ptr *)0x0) break;
        pcVar16 = "glGenTextures";
        ctx.glGenTextures = (_func_void_GLsizei_GLuint_ptr *)SDL_GL_GetProcAddress("glGenTextures");
        if (ctx.glGenTextures == (_func_void_GLsizei_GLuint_ptr *)0x0) break;
        pcVar16 = "glGetBooleanv";
        ctx.glGetBooleanv =
             (_func_void_GLenum_GLboolean_ptr *)SDL_GL_GetProcAddress("glGetBooleanv");
        if (ctx.glGetBooleanv == (_func_void_GLenum_GLboolean_ptr *)0x0) break;
        pcVar16 = "glGetString";
        ctx.glGetString = (_func_GLubyte_ptr_GLenum *)SDL_GL_GetProcAddress("glGetString");
        if (ctx.glGetString == (_func_GLubyte_ptr_GLenum *)0x0) break;
        pcVar16 = "glGetError";
        ctx.glGetError = (_func_GLenum *)SDL_GL_GetProcAddress("glGetError");
        if (ctx.glGetError == (_func_GLenum *)0x0) break;
        pcVar16 = "glGetIntegerv";
        ctx.glGetIntegerv = (_func_void_GLenum_GLint_ptr *)SDL_GL_GetProcAddress("glGetIntegerv");
        if (ctx.glGetIntegerv == (_func_void_GLenum_GLint_ptr *)0x0) break;
        pcVar16 = "glGetProgramiv";
        ctx.glGetProgramiv =
             (_func_void_GLuint_GLenum_GLint_ptr *)SDL_GL_GetProcAddress("glGetProgramiv");
        if (ctx.glGetProgramiv == (_func_void_GLuint_GLenum_GLint_ptr *)0x0) break;
        pcVar16 = "glGetShaderInfoLog";
        ctx.glGetShaderInfoLog =
             (_func_void_GLuint_GLsizei_GLsizei_ptr_char_ptr *)
             SDL_GL_GetProcAddress("glGetShaderInfoLog");
        if (ctx.glGetShaderInfoLog == (_func_void_GLuint_GLsizei_GLsizei_ptr_char_ptr *)0x0) break;
        pcVar16 = "glGetShaderiv";
        ctx.glGetShaderiv =
             (_func_void_GLuint_GLenum_GLint_ptr *)SDL_GL_GetProcAddress("glGetShaderiv");
        if (ctx.glGetShaderiv == (_func_void_GLuint_GLenum_GLint_ptr *)0x0) break;
        pcVar16 = "glGetUniformLocation";
        ctx.glGetUniformLocation =
             (_func_GLint_GLuint_char_ptr *)SDL_GL_GetProcAddress("glGetUniformLocation");
        if (ctx.glGetUniformLocation == (_func_GLint_GLuint_char_ptr *)0x0) break;
        pcVar16 = "glLinkProgram";
        ctx.glLinkProgram = (_func_void_GLuint *)SDL_GL_GetProcAddress("glLinkProgram");
        if (ctx.glLinkProgram == (_func_void_GLuint *)0x0) break;
        pcVar16 = "glPixelStorei";
        ctx.glPixelStorei = (_func_void_GLenum_GLint *)SDL_GL_GetProcAddress("glPixelStorei");
        if (ctx.glPixelStorei == (_func_void_GLenum_GLint *)0x0) break;
        pcVar16 = "glReadPixels";
        ctx.glReadPixels =
             (_func_void_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr *)
             SDL_GL_GetProcAddress("glReadPixels");
        if (ctx.glReadPixels ==
            (_func_void_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr *)0x0) break;
        pcVar16 = "glScissor";
        ctx.glScissor = (_func_void_GLint_GLint_GLsizei_GLsizei *)SDL_GL_GetProcAddress("glScissor")
        ;
        if (ctx.glScissor == (_func_void_GLint_GLint_GLsizei_GLsizei *)0x0) break;
        pcVar16 = "glShaderBinary";
        ctx.glShaderBinary =
             (_func_void_GLsizei_GLuint_ptr_GLenum_void_ptr_GLsizei *)
             SDL_GL_GetProcAddress("glShaderBinary");
        if (ctx.glShaderBinary == (_func_void_GLsizei_GLuint_ptr_GLenum_void_ptr_GLsizei *)0x0)
        break;
        pcVar16 = "glShaderSource";
        ctx.glShaderSource =
             (_func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr *)
             SDL_GL_GetProcAddress("glShaderSource");
        if (ctx.glShaderSource == (_func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr *)0x0) break;
        pcVar16 = "glTexImage2D";
        ctx.glTexImage2D =
             (_func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_void_ptr *)
             SDL_GL_GetProcAddress("glTexImage2D");
        if (ctx.glTexImage2D ==
            (_func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_void_ptr *)0x0)
        break;
        pcVar16 = "glTexParameteri";
        ctx.glTexParameteri =
             (_func_void_GLenum_GLenum_GLint *)SDL_GL_GetProcAddress("glTexParameteri");
        if (ctx.glTexParameteri == (_func_void_GLenum_GLenum_GLint *)0x0) break;
        pcVar16 = "glTexSubImage2D";
        ctx.glTexSubImage2D =
             (_func_void_GLenum_GLint_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr *)
             SDL_GL_GetProcAddress("glTexSubImage2D");
        if (ctx.glTexSubImage2D ==
            (_func_void_GLenum_GLint_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr *)0x0)
        break;
        pcVar16 = "glUniform1i";
        ctx.glUniform1i = (_func_void_GLint_GLint *)SDL_GL_GetProcAddress("glUniform1i");
        if (ctx.glUniform1i == (_func_void_GLint_GLint *)0x0) break;
        pcVar16 = "glUniform4f";
        ctx.glUniform4f =
             (_func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *)
             SDL_GL_GetProcAddress("glUniform4f");
        if (ctx.glUniform4f == (_func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *)0x0) break;
        pcVar16 = "glUniformMatrix4fv";
        ctx.glUniformMatrix4fv =
             (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
             SDL_GL_GetProcAddress("glUniformMatrix4fv");
        if (ctx.glUniformMatrix4fv == (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)0x0) break;
        pcVar16 = "glUseProgram";
        ctx.glUseProgram = (_func_void_GLuint *)SDL_GL_GetProcAddress("glUseProgram");
        if (ctx.glUseProgram == (_func_void_GLuint *)0x0) break;
        pcVar16 = "glVertexAttribPointer";
        ctx.glVertexAttribPointer =
             (_func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_void_ptr *)
             SDL_GL_GetProcAddress("glVertexAttribPointer");
        if (ctx.glVertexAttribPointer ==
            (_func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_void_ptr *)0x0) break;
        pcVar16 = "glViewport";
        ctx.glViewport =
             (_func_void_GLint_GLint_GLsizei_GLsizei *)SDL_GL_GetProcAddress("glViewport");
        if (ctx.glViewport == (_func_void_GLint_GLint_GLsizei_GLsizei *)0x0) break;
        pcVar16 = "glBindFramebuffer";
        ctx.glBindFramebuffer =
             (_func_void_GLenum_GLuint *)SDL_GL_GetProcAddress("glBindFramebuffer");
        if (ctx.glBindFramebuffer == (_func_void_GLenum_GLuint *)0x0) break;
        pcVar16 = "glFramebufferTexture2D";
        ctx.glFramebufferTexture2D =
             (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
             SDL_GL_GetProcAddress("glFramebufferTexture2D");
        if (ctx.glFramebufferTexture2D == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)0x0)
        break;
        pcVar16 = "glCheckFramebufferStatus";
        ctx.glCheckFramebufferStatus =
             (_func_GLenum_GLenum *)SDL_GL_GetProcAddress("glCheckFramebufferStatus");
        if (ctx.glCheckFramebufferStatus == (_func_GLenum_GLenum *)0x0) break;
        pcVar16 = "glDeleteFramebuffers";
        ctx.glDeleteFramebuffers =
             (_func_void_GLsizei_GLuint_ptr *)SDL_GL_GetProcAddress("glDeleteFramebuffers");
        if (ctx.glDeleteFramebuffers == (_func_void_GLsizei_GLuint_ptr *)0x0) break;
        pcVar16 = "glGetAttribLocation";
        ctx.glGetAttribLocation =
             (_func_GLint_GLuint_GLchar_ptr *)SDL_GL_GetProcAddress("glGetAttribLocation");
        if (ctx.glGetAttribLocation == (_func_GLint_GLuint_GLchar_ptr *)0x0) break;
        pcVar16 = "glGetProgramInfoLog";
        ctx.glGetProgramInfoLog =
             (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)
             SDL_GL_GetProcAddress("glGetProgramInfoLog");
        if (ctx.glGetProgramInfoLog == (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)0x0)
        break;
        pcVar16 = "glGenBuffers";
        ctx.glGenBuffers = (_func_void_GLsizei_GLuint_ptr *)SDL_GL_GetProcAddress("glGenBuffers");
        if (ctx.glGenBuffers == (_func_void_GLsizei_GLuint_ptr *)0x0) break;
        pcVar16 = "glBindBuffer";
        ctx.glBindBuffer = (_func_void_GLenum_GLuint *)SDL_GL_GetProcAddress("glBindBuffer");
        if (ctx.glBindBuffer == (_func_void_GLenum_GLuint *)0x0) break;
        pcVar16 = "glBufferData";
        ctx.glBufferData =
             (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)SDL_GL_GetProcAddress("glBufferData")
        ;
        if (ctx.glBufferData == (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)0x0) break;
        pcVar16 = "glBufferSubData";
        ctx.glBufferSubData =
             (_func_void_GLenum_GLintptr_GLsizeiptr_GLvoid_ptr *)
             SDL_GL_GetProcAddress("glBufferSubData");
      } while (ctx.glBufferSubData != (_func_void_GLenum_GLintptr_GLsizeiptr_GLvoid_ptr *)0x0);
      uVar10 = SDL_GetError();
      iVar4 = SDL_SetError("Couldn\'t load GLES2 function %s: %s\n",pcVar16,uVar10);
    } while (-1 < iVar4);
    pcVar16 = "Could not load GLES2 functions\n";
  } while( true );
}

Assistant:

int
main(int argc, char *argv[])
{
    int fsaa, accel;
    int value;
    int i;
    SDL_DisplayMode mode;
    Uint32 then, now;
    int status;
    shader_data *data;

    /* Initialize parameters */
    fsaa = 0;
    accel = 0;

    /* Initialize test framework */
    state = SDLTest_CommonCreateState(argv, SDL_INIT_VIDEO);
    if (!state) {
        return 1;
    }
    for (i = 1; i < argc;) {
        int consumed;

        consumed = SDLTest_CommonArg(state, i);
        if (consumed == 0) {
            if (SDL_strcasecmp(argv[i], "--fsaa") == 0) {
                ++fsaa;
                consumed = 1;
            } else if (SDL_strcasecmp(argv[i], "--accel") == 0) {
                ++accel;
                consumed = 1;
            } else if (SDL_strcasecmp(argv[i], "--zdepth") == 0) {
                i++;
                if (!argv[i]) {
                    consumed = -1;
                } else {
                    depth = SDL_atoi(argv[i]);
                    consumed = 1;
                }
            } else {
                consumed = -1;
            }
        }
        if (consumed < 0) {
            SDL_Log ("Usage: %s %s [--fsaa] [--accel] [--zdepth %%d]\n", argv[0],
                    SDLTest_CommonUsage(state));
            quit(1);
        }
        i += consumed;
    }

    /* Set OpenGL parameters */
    state->window_flags |= SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_BORDERLESS | SDL_WINDOW_FULLSCREEN;
    state->gl_red_size = 5;
    state->gl_green_size = 5;
    state->gl_blue_size = 5;
    state->gl_depth_size = depth;
    state->gl_major_version = 2;
    state->gl_minor_version = 0;
    state->gl_profile_mask = SDL_GL_CONTEXT_PROFILE_ES;

    if (fsaa) {
        state->gl_multisamplebuffers=1;
        state->gl_multisamplesamples=fsaa;
    }
    if (accel) {
        state->gl_accelerated=1;
    }
    if (!SDLTest_CommonInit(state)) {
        quit(2);
        return 0;
    }

    context = SDL_calloc(state->num_windows, sizeof(context));
    if (context == NULL) {
        SDL_Log("Out of memory!\n");
        quit(2);
    }
    
    /* Create OpenGL ES contexts */
    for (i = 0; i < state->num_windows; i++) {
        context[i] = SDL_GL_CreateContext(state->windows[i]);
        if (!context[i]) {
            SDL_Log("SDL_GL_CreateContext(): %s\n", SDL_GetError());
            quit(2);
        }
    }

    /* Important: call this *after* creating the context */
    if (LoadContext(&ctx) < 0) {
        SDL_Log("Could not load GLES2 functions\n");
        quit(2);
        return 0;
    }


    if (state->render_flags & SDL_RENDERER_PRESENTVSYNC) {
        SDL_GL_SetSwapInterval(1);
    } else {
        SDL_GL_SetSwapInterval(0);
    }

    SDL_GetCurrentDisplayMode(0, &mode);
    SDL_Log("Screen bpp: %d\n", SDL_BITSPERPIXEL(mode.format));
    SDL_Log("\n");
    SDL_Log("Vendor     : %s\n", ctx.glGetString(GL_VENDOR));
    SDL_Log("Renderer   : %s\n", ctx.glGetString(GL_RENDERER));
    SDL_Log("Version    : %s\n", ctx.glGetString(GL_VERSION));
    SDL_Log("Extensions : %s\n", ctx.glGetString(GL_EXTENSIONS));
    SDL_Log("\n");

    status = SDL_GL_GetAttribute(SDL_GL_RED_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_RED_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_RED_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_GREEN_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_GREEN_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_GREEN_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_BLUE_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_BLUE_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_BLUE_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_DEPTH_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_DEPTH_SIZE: requested %d, got %d\n", depth, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_DEPTH_SIZE: %s\n",
                SDL_GetError());
    }
    if (fsaa) {
        status = SDL_GL_GetAttribute(SDL_GL_MULTISAMPLEBUFFERS, &value);
        if (!status) {
            SDL_Log("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n", value);
        } else {
            SDL_Log( "Failed to get SDL_GL_MULTISAMPLEBUFFERS: %s\n",
                    SDL_GetError());
        }
        status = SDL_GL_GetAttribute(SDL_GL_MULTISAMPLESAMPLES, &value);
        if (!status) {
            SDL_Log("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n", fsaa,
                   value);
        } else {
            SDL_Log( "Failed to get SDL_GL_MULTISAMPLESAMPLES: %s\n",
                    SDL_GetError());
        }
    }
    if (accel) {
        status = SDL_GL_GetAttribute(SDL_GL_ACCELERATED_VISUAL, &value);
        if (!status) {
            SDL_Log("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n", value);
        } else {
            SDL_Log( "Failed to get SDL_GL_ACCELERATED_VISUAL: %s\n",
                    SDL_GetError());
        }
    }

    datas = SDL_calloc(state->num_windows, sizeof(shader_data));

    /* Set rendering settings for each context */
    for (i = 0; i < state->num_windows; ++i) {

        int w, h;
        status = SDL_GL_MakeCurrent(state->windows[i], context[i]);
        if (status) {
            SDL_Log("SDL_GL_MakeCurrent(): %s\n", SDL_GetError());

            /* Continue for next window */
            continue;
        }
        SDL_GL_GetDrawableSize(state->windows[i], &w, &h);
        ctx.glViewport(0, 0, w, h);

        data = &datas[i];
        data->angle_x = 0; data->angle_y = 0; data->angle_z = 0;

        /* Shader Initialization */
        process_shader(&data->shader_vert, _shader_vert_src, GL_VERTEX_SHADER);
        process_shader(&data->shader_frag, _shader_frag_src, GL_FRAGMENT_SHADER);

        /* Create shader_program (ready to attach shaders) */
        data->shader_program = GL_CHECK(ctx.glCreateProgram());

        /* Attach shaders and link shader_program */
        GL_CHECK(ctx.glAttachShader(data->shader_program, data->shader_vert));
        GL_CHECK(ctx.glAttachShader(data->shader_program, data->shader_frag));
        GL_CHECK(ctx.glLinkProgram(data->shader_program));

        /* Get attribute locations of non-fixed attributes like color and texture coordinates. */
        data->attr_position = GL_CHECK(ctx.glGetAttribLocation(data->shader_program, "av4position"));
        data->attr_color = GL_CHECK(ctx.glGetAttribLocation(data->shader_program, "av3color"));

        /* Get uniform locations */
        data->attr_mvp = GL_CHECK(ctx.glGetUniformLocation(data->shader_program, "mvp"));

        GL_CHECK(ctx.glUseProgram(data->shader_program));

        /* Enable attributes for position, color and texture coordinates etc. */
        GL_CHECK(ctx.glEnableVertexAttribArray(data->attr_position));
        GL_CHECK(ctx.glEnableVertexAttribArray(data->attr_color));

        /* Populate attributes for position, color and texture coordinates etc. */
        GL_CHECK(ctx.glVertexAttribPointer(data->attr_position, 3, GL_FLOAT, GL_FALSE, 0, _vertices));
        GL_CHECK(ctx.glVertexAttribPointer(data->attr_color, 3, GL_FLOAT, GL_FALSE, 0, _colors));

        GL_CHECK(ctx.glEnable(GL_CULL_FACE));
        GL_CHECK(ctx.glEnable(GL_DEPTH_TEST));
    }

    /* Main render loop */
    frames = 0;
    then = SDL_GetTicks();
    done = 0;

    while (!done) {
        loop();
    }

    /* Print out some timing information */
    now = SDL_GetTicks();

    if (now > then) {
        SDL_Log("%2.2f frames per second\n",
               ((double) frames * 1000) / (now - then));
    }

    quit(0);
    return 0;
}